

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TcpConnection.cpp
# Opt level: O0

void __thiscall sznet::net::TcpConnection::shutdownInLoop(TcpConnection *this)

{
  bool bVar1;
  pointer this_00;
  pointer this_01;
  TcpConnection *this_local;
  
  EventLoop::assertInLoopThread(this->m_loop);
  this_00 = std::unique_ptr<sznet::net::Channel,_std::default_delete<sznet::net::Channel>_>::
            operator->(&this->m_channel);
  bVar1 = Channel::isWriting(this_00);
  if (!bVar1) {
    this_01 = std::unique_ptr<sznet::net::Socket,_std::default_delete<sznet::net::Socket>_>::
              operator->(&this->m_socket);
    Socket::shutdownWrite(this_01);
  }
  return;
}

Assistant:

void TcpConnection::shutdownInLoop()
{
	m_loop->assertInLoopThread();
	// û��ע��д�¼��Ļ������رգ��ر�д��
	if (!m_channel->isWriting())
	{
		m_socket->shutdownWrite();
	}
}